

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O3

bool __thiscall DLoadSaveMenu::Responder(DLoadSaveMenu *this,event_t *ev)

{
  BYTE BVar1;
  short sVar2;
  FSaveGameNode *pFVar3;
  bool bVar4;
  int iVar5;
  FBrokenLines *pFVar6;
  char *pcVar7;
  char *pcVar8;
  char workbuf [512];
  FName local_21c;
  FString local_218 [65];
  
  if (ev->type != '\x04') {
LAB_0030b9a6:
    bVar4 = DListMenu::Responder(&this->super_DListMenu,ev);
    return bVar4;
  }
  BVar1 = ev->subtype;
  if (BVar1 == '\x11') {
    if ((int)(SaveGames.Count - this->listboxRows) <= this->TopItem) {
      return true;
    }
    iVar5 = this->TopItem + 1;
  }
  else {
    if (BVar1 != '\x10') {
      if ((BVar1 == '\x01') && ((uint)this->Selected < SaveGames.Count)) {
        sVar2 = ev->data1;
        if ((sVar2 == 8) || (sVar2 == 0x1a)) {
          local_218[0].Chars = FString::NullString.Nothing;
          FString::NullString.RefCount = FString::NullString.RefCount + 1;
          pcVar7 = FStringTable::operator()(&GStrings,"MNU_DELETESG");
          pFVar3 = SaveGames.Array[this->Selected];
          pcVar8 = FStringTable::operator()(&GStrings,"PRESSYN");
          FString::Format(local_218,"%s\x1cJ%s\x1c-?\n\n%s",pcVar7,pFVar3,pcVar8);
          local_21c.Index = 0;
          M_StartMessage(local_218[0].Chars,0,&local_21c);
          FString::~FString(local_218);
          return true;
        }
        if (sVar2 == 0xe) {
          if (*(int *)((SaveGames.Array[this->Selected]->Filename).Chars + -0xc) == 0) {
            return true;
          }
          mysnprintf((char *)local_218,0x200,"File on disk:\n%s");
          if (this->SaveComment != (FBrokenLines *)0x0) {
            V_FreeBrokenLines(this->SaveComment);
          }
          pFVar6 = V_BreakLines(SmallFont,
                                (((screen->super_DSimpleCanvas).super_DCanvas.Width * 0xd8) / 0x280)
                                / CleanXfac,(BYTE *)local_218,false);
          this->SaveComment = pFVar6;
          return true;
        }
      }
      goto LAB_0030b9a6;
    }
    if (this->TopItem < 1) {
      return true;
    }
    iVar5 = this->TopItem + -1;
  }
  this->TopItem = iVar5;
  return true;
}

Assistant:

bool DLoadSaveMenu::Responder (event_t *ev)
{
	if (ev->type == EV_GUI_Event)
	{
		if (ev->subtype == EV_GUI_KeyDown)
		{
			if ((unsigned)Selected < SaveGames.Size())
			{
				switch (ev->data1)
				{
				case GK_F1:
					if (!SaveGames[Selected]->Filename.IsEmpty())
					{
						char workbuf[512];

						mysnprintf (workbuf, countof(workbuf), "File on disk:\n%s", SaveGames[Selected]->Filename.GetChars());
						if (SaveComment != NULL)
						{
							V_FreeBrokenLines (SaveComment);
						}
						SaveComment = V_BreakLines (SmallFont, 216*screen->GetWidth()/640/CleanXfac, workbuf);
					}
					return true;

				case GK_DEL:
				case '\b':
					{
						FString EndString;
						EndString.Format("%s" TEXTCOLOR_WHITE "%s" TEXTCOLOR_NORMAL "?\n\n%s",
							GStrings("MNU_DELETESG"), SaveGames[Selected]->Title, GStrings("PRESSYN"));
						M_StartMessage (EndString, 0);
					}
					return true;
				}
			}
		}
		else if (ev->subtype == EV_GUI_WheelUp)
		{
			if (TopItem > 0) TopItem--;
			return true;
		}
		else if (ev->subtype == EV_GUI_WheelDown)
		{
			if (TopItem < (int)SaveGames.Size() - listboxRows) TopItem++;
			return true;
		}
	}
	return Super::Responder(ev);
}